

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_str_send(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  nng_err nVar2;
  nni_msg *msg;
  size_t sVar3;
  void *pvVar4;
  ws_frame *frame;
  bool bVar5;
  undefined1 local_58 [8];
  nni_iov iov [2];
  
  nni_aio_reset(aio);
  if (*(char *)((long)arg + 0x55) == '\0') {
    msg = nni_aio_get_msg(aio);
    if (msg == (nni_msg *)0x0) {
      nVar2 = NNG_EINVAL;
      goto LAB_0012b588;
    }
    sVar3 = nng_msg_header_len(msg);
    bVar5 = sVar3 != 0;
    if (bVar5) {
      iov[0].iov_buf = (void *)nni_msg_header_len(msg);
      local_58 = (undefined1  [8])nni_msg_header(msg);
    }
    pvVar4 = (void *)nni_msg_len(msg);
    iov[bVar5].iov_buf = pvVar4;
    pvVar4 = nni_msg_body(msg);
    iov[(ulong)bVar5 - 1].iov_len = (size_t)pvVar4;
    nni_aio_set_iov(aio,bVar5 + 1,(nni_iov *)local_58);
  }
  frame = (ws_frame *)nni_zalloc(0xd8);
  if (frame == (ws_frame *)0x0) {
    nVar2 = NNG_ENOMEM;
LAB_0012b588:
    nni_aio_finish_error(aio,nVar2);
    return;
  }
  frame->aio = aio;
  nVar2 = ws_frame_prep_tx((nni_ws *)arg,frame);
  if (nVar2 == NNG_OK) {
    mtx = (nni_mtx *)((long)arg + 0x60);
    nni_mtx_lock(mtx);
    if (*(char *)((long)arg + 0x51) != '\x01') {
      _Var1 = nni_aio_start(aio,ws_write_cancel,arg);
      if (_Var1) {
        nni_aio_set_prov_data(aio,frame);
        nni_list_append((nni_list *)((long)arg + 0x88),aio);
        nni_list_append((nni_list *)((long)arg + 0xb8),frame);
        ws_start_write((nni_ws *)arg);
        nni_mtx_unlock(mtx);
        return;
      }
      nni_mtx_unlock(mtx);
      goto LAB_0012b5b7;
    }
    nni_mtx_unlock(mtx);
    nVar2 = NNG_ECLOSED;
  }
  nni_aio_finish_error(aio,nVar2);
LAB_0012b5b7:
  ws_frame_fini(frame);
  return;
}

Assistant:

static void
ws_str_send(void *arg, nni_aio *aio)
{
	nni_ws   *ws = arg;
	int       rv;
	ws_frame *frame;

	nni_aio_reset(aio);

	if (!ws->isstream) {
		nni_msg *msg;
		unsigned niov;
		nni_iov  iov[2];
		if ((msg = nni_aio_get_msg(aio)) == NULL) {
			nni_aio_finish_error(aio, NNG_EINVAL);
			return;
		}
		niov = 0;
		if (nng_msg_header_len(msg) > 0) {
			iov[niov].iov_len = nni_msg_header_len(msg);
			iov[niov].iov_buf = nni_msg_header(msg);
			niov++;
		}
		iov[niov].iov_len = nni_msg_len(msg);
		iov[niov].iov_buf = nni_msg_body(msg);
		niov++;

		// Scribble into the iov for now.
		nni_aio_set_iov(aio, niov, iov);
	}

	if ((frame = NNI_ALLOC_STRUCT(frame)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}
	frame->aio = aio;
	if ((rv = ws_frame_prep_tx(ws, frame)) != 0) {
		nni_aio_finish_error(aio, rv);
		ws_frame_fini(frame);
		return;
	}

	nni_mtx_lock(&ws->mtx);

	if (ws->closed) {
		nni_mtx_unlock(&ws->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		ws_frame_fini(frame);
		return;
	}
	if (!nni_aio_start(aio, ws_write_cancel, ws)) {
		nni_mtx_unlock(&ws->mtx);
		ws_frame_fini(frame);
		return;
	}
	nni_aio_set_prov_data(aio, frame);
	nni_list_append(&ws->sendq, aio);
	nni_list_append(&ws->txq, frame);
	ws_start_write(ws);
	nni_mtx_unlock(&ws->mtx);
}